

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4x4.cpp
# Opt level: O3

Matrix4x4 * __thiscall CMU462::Matrix4x4::T(Matrix4x4 *__return_storage_ptr__,Matrix4x4 *this)

{
  Matrix4x4 *pMVar1;
  int i;
  long lVar2;
  Matrix4x4 *A;
  Matrix4x4 *B;
  long lVar3;
  
  pMVar1 = __return_storage_ptr__;
  __return_storage_ptr__->entries[3].z = 0.0;
  __return_storage_ptr__->entries[3].w = 0.0;
  __return_storage_ptr__->entries[3].x = 0.0;
  __return_storage_ptr__->entries[3].y = 0.0;
  __return_storage_ptr__->entries[2].z = 0.0;
  __return_storage_ptr__->entries[2].w = 0.0;
  __return_storage_ptr__->entries[2].x = 0.0;
  __return_storage_ptr__->entries[2].y = 0.0;
  __return_storage_ptr__->entries[1].z = 0.0;
  __return_storage_ptr__->entries[1].w = 0.0;
  __return_storage_ptr__->entries[1].x = 0.0;
  __return_storage_ptr__->entries[1].y = 0.0;
  __return_storage_ptr__->entries[0].z = 0.0;
  __return_storage_ptr__->entries[0].w = 0.0;
  __return_storage_ptr__->entries[0].x = 0.0;
  __return_storage_ptr__->entries[0].y = 0.0;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)__return_storage_ptr__ + lVar3 * 4) =
           *(undefined8 *)((long)&((Vector4D *)&this->entries[0].x)->x + lVar3);
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    lVar2 = lVar2 + 1;
    this = (Matrix4x4 *)((long)this + 0x20);
    __return_storage_ptr__ = (Matrix4x4 *)((long)__return_storage_ptr__ + 8);
  } while (lVar2 != 4);
  return pMVar1;
}

Assistant:

Matrix4x4 Matrix4x4::T( void ) const {
    const Matrix4x4& A( *this );
    Matrix4x4 B;

    for( int i = 0; i < 4; i++ )
    for( int j = 0; j < 4; j++ )
    {
       B(i,j) = A(j,i);
    }

    return B;
  }